

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_archiver.cpp
# Opt level: O1

vector<bool,_std::allocator<bool>_> *
HuffmanArchiver::decode_full_code
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,
          vector<bool,_std::allocator<bool>_> *full_code)

{
  ulong *puVar1;
  int iVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  puVar1 = (full_code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  if ((*puVar1 & 1) == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    do {
      uVar3 = (ulong)(iVar2 + 1);
      if (iVar2 == 0x3f) {
        uVar3 = 0;
      }
      puVar1 = puVar1 + (iVar2 == 0x3f);
      iVar2 = (int)uVar3;
    } while ((*puVar1 >> (uVar3 & 0x3f) & 1) != 0);
  }
  puVar1 = puVar1 + (iVar2 == 0x3f);
  uVar3 = (ulong)(iVar2 + 1);
  if (iVar2 == 0x3f) {
    uVar3 = 0;
  }
  if ((puVar1 != (full_code->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) ||
     ((uint)uVar3 !=
      (full_code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset)) {
    do {
      std::vector<bool,_std::allocator<bool>_>::push_back
                (__return_storage_ptr__,(*puVar1 >> (uVar3 & 0x3f) & 1) != 0);
      iVar2 = (int)uVar3;
      puVar1 = puVar1 + (iVar2 == 0x3f);
      uVar3 = (ulong)(iVar2 + 1);
      if (iVar2 == 0x3f) {
        uVar3 = 0;
      }
    } while ((puVar1 != (full_code->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) ||
            ((uint)uVar3 !=
             (full_code->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<bool> HuffmanArchiver::decode_full_code(std::vector<bool> full_code) {
    std::vector<bool> code;
    auto it = full_code.begin();
    while (*it == 1) {
        it++;
    }
    it++;
    for (; it != full_code.end(); it++) {
        code.push_back(*it);
    }
    return code;
}